

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters.cpp
# Opt level: O0

QSslDiffieHellmanParameters
QSslDiffieHellmanParameters::fromEncoded(QIODevice *device,EncodingFormat encoding)

{
  long lVar1;
  long in_RSI;
  QSslDiffieHellmanParametersPrivate *in_RDI;
  long in_FS_OFFSET;
  EncodingFormat in_stack_ffffffffffffffe4;
  QByteArray *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QSslDiffieHellmanParameters((QSslDiffieHellmanParameters *)in_RDI);
  }
  else {
    QIODevice::readAll();
    fromEncoded(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
    QByteArray::~QByteArray((QByteArray *)0x395cd3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSslDiffieHellmanParameters)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QSslDiffieHellmanParameters QSslDiffieHellmanParameters::fromEncoded(QIODevice *device, QSsl::EncodingFormat encoding)
{
    if (device)
        return fromEncoded(device->readAll(), encoding);
    else
        return QSslDiffieHellmanParameters();
}